

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall FileTest_CloseFileInDtor_Test::TestBody(FileTest_CloseFileInDtor_Test *this)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  char *unaff_retaddr;
  AssertionResult *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar_;
  file f;
  int fd;
  file *this_00;
  undefined1 success;
  undefined8 in_stack_ffffffffffffff90;
  int fd_00;
  AssertionResult *this_01;
  file *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_20;
  file in_stack_fffffffffffffff0;
  
  fd_00 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  this_00 = (file *)&stack0xfffffffffffffff0;
  open_file();
  iVar2 = fmt::v5::file::descriptor(this_00);
  success = (undefined1)((ulong)this_00 >> 0x38);
  fmt::v5::file::~file(in_stack_ffffffffffffffa0);
  isclosed(fd_00);
  this_01 = &local_20;
  testing::AssertionResult::AssertionResult(this_01,(bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_00000008,unaff_retaddr,in_RDI,
               (char *)CONCAT44(iVar2,in_stack_fffffffffffffff0.fd_));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,(char *)in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,(Message *)in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    testing::Message::~Message((Message *)0x11472d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114787);
  return;
}

Assistant:

TEST(FileTest, CloseFileInDtor) {
  int fd = 0;
  {
    file f = open_file();
    fd = f.descriptor();
  }
  EXPECT_TRUE(isclosed(fd));
}